

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knight.cpp
# Opt level: O0

void knight(Node *root,int row,int col,bool side)

{
  char target_00;
  int p;
  int q;
  bool bVar1;
  char target;
  int c;
  int r;
  int i;
  int col_pos [8];
  int row_pos [8];
  bool side_local;
  int col_local;
  int row_local;
  Node *root_local;
  
  col_pos[6] = row + -2;
  col_pos[7] = row + -2;
  r = col + -1;
  i = col + 1;
  col_pos[0] = col + -2;
  col_pos[1] = col + 2;
  col_pos[2] = col + -2;
  col_pos[3] = col + 2;
  col_pos[4] = col + -1;
  col_pos[5] = col + 1;
  for (c = 0; c < 8; c = c + 1) {
    p = col_pos[(long)c + 6];
    q = (&r)[c];
    target_00 = (*root)->board[p][q];
    if (target_00 != 'x') {
      bVar1 = same_side(side,target_00);
      if (!bVar1) {
        tree_insert(root,row,col,p,q);
      }
    }
  }
  return;
}

Assistant:

void knight(Node& root, int row, int col, bool side){

    // Arrays store possible coordinates for a Knight
    int row_pos[8] = {row-2, row-2, row-1, row-1, row+1, row+1, row+2, row+2};
    int col_pos[8] = {col-1, col+1, col-2, col+2, col-2, col+2, col-1, col+1};

    int i, r, c;
    char target;
    for(i=0; i<8; i++){
        r = row_pos[i];
        c = col_pos[i];
        target = root->board[r][c];
        if('x' != target && !same_side(side, target))
            tree_insert(root, row, col, r, c);
    }
}